

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_assign(Curl_multi *multi,curl_socket_t s,void *hashp)

{
  Curl_sh_entry *pCVar1;
  Curl_sh_entry *there;
  void *hashp_local;
  curl_socket_t s_local;
  Curl_multi *multi_local;
  
  pCVar1 = sh_getentry(&multi->sockhash,s);
  if (pCVar1 == (Curl_sh_entry *)0x0) {
    multi_local._4_4_ = CURLM_BAD_SOCKET;
  }
  else {
    pCVar1->socketp = hashp;
    multi_local._4_4_ = CURLM_OK;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_assign(struct Curl_multi *multi, curl_socket_t s,
                            void *hashp)
{
  struct Curl_sh_entry *there = NULL;

  there = sh_getentry(&multi->sockhash, s);

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}